

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

uint __thiscall
QFragmentMapData<QTextFragmentData>::next(QFragmentMapData<QTextFragmentData> *this,uint n)

{
  uint uVar1;
  Header *pHVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  pHVar2 = (this->field_0).head;
  lVar4 = (ulong)n * 0x20;
  uVar1 = *(uint *)((long)pHVar2 + lVar4 + 8);
  if (uVar1 == 0) {
    do {
      uVar3 = *(uint *)((long)&pHVar2->root + lVar4);
      if (*(int *)((long)pHVar2 + (ulong)n * 0x20) == 0) {
        return uVar3;
      }
      lVar4 = (ulong)uVar3 * 0x20;
      bVar5 = n == *(uint *)((long)pHVar2 + lVar4 + 8);
      n = uVar3;
    } while (bVar5);
  }
  else {
    do {
      uVar3 = uVar1;
      uVar1 = *(uint *)((long)pHVar2 + (ulong)uVar3 * 0x20 + 4);
    } while (uVar1 != 0);
  }
  return uVar3;
}

Assistant:

inline const Fragment &F(uint index) const { return fragments[index] ; }